

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

void __thiscall
duckdb_snappy::internal::WorkingMemory::WorkingMemory(WorkingMemory *this,size_t input_size)

{
  int iVar1;
  uint uVar2;
  uint16_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = 0x10000;
  uVar5 = 0x10000;
  if (input_size < 0x10000) {
    uVar5 = input_size;
  }
  if ((input_size < 0x8001) && (uVar6 = 0x200, 0xff < input_size)) {
    uVar2 = (int)uVar5 - 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar6 = (ulong)(uint)(4 << ((byte)iVar1 & 0x1f));
  }
  uVar4 = uVar6 + (uVar5 & 0xffffffff) / 6 + uVar5 * 2 + 0x20;
  this->size_ = uVar4;
  puVar3 = (uint16_t *)operator_new(uVar4);
  this->mem_ = (char *)puVar3;
  this->table_ = puVar3;
  this->input_ = (char *)((long)puVar3 + uVar6);
  this->output_ = (char *)((long)puVar3 + uVar6) + uVar5;
  return;
}

Assistant:

WorkingMemory::WorkingMemory(size_t input_size) {
  const size_t max_fragment_size = std::min(input_size, kBlockSize);
  const size_t table_size = CalculateTableSize(max_fragment_size);
  size_ = table_size * sizeof(*table_) + max_fragment_size +
          MaxCompressedLength(max_fragment_size);
  mem_ = std::allocator<char>().allocate(size_);
  table_ = reinterpret_cast<uint16_t*>(mem_);
  input_ = mem_ + table_size * sizeof(*table_);
  output_ = input_ + max_fragment_size;
}